

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::SuperClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor)

{
  char *__s;
  allocator<char> local_9;
  
  __s = "::google::protobuf::Message";
  if (*(int *)(*(long *)(*(long *)(this + 0x10) + 0x88) + 0x50) == 3) {
    __s = "::google::protobuf::MessageLite";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

string SuperClassName(const Descriptor* descriptor) {
  return HasDescriptorMethods(descriptor->file()) ?
      "::google::protobuf::Message" : "::google::protobuf::MessageLite";
}